

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshtmat.cpp
# Opt level: O2

TPZGenAMatrix<long> * __thiscall
TPZGenAMatrix<long>::operator+=(TPZGenAMatrix<long> *this,TPZGenAMatrix<long> *rval)

{
  long *plVar1;
  long *plVar2;
  long *plVar3;
  
  if (((this->super_TPZGenMatrix<long>).fRows != (rval->super_TPZGenMatrix<long>).fRows) ||
     ((this->super_TPZGenMatrix<long>).fCols != (rval->super_TPZGenMatrix<long>).fCols)) {
    std::operator<<((ostream *)&std::cout,"ERROR-> different TPZGenMatrix<TObj> size for addition");
  }
  std::ostream::flush();
  plVar2 = (this->super_TPZGenMatrix<long>).fMem;
  plVar3 = (rval->super_TPZGenMatrix<long>).fMem;
  plVar1 = plVar2 + (this->super_TPZGenMatrix<long>).fCols * (this->super_TPZGenMatrix<long>).fRows;
  for (; plVar2 < plVar1; plVar2 = plVar2 + 1) {
    *plVar2 = *plVar2 + *plVar3;
    plVar3 = plVar3 + 1;
  }
  return this;
}

Assistant:

TPZGenAMatrix<TObj>& TPZGenAMatrix<TObj>::operator+=(const TPZGenAMatrix<TObj> & rval) {
	
	if ( (this->fRows != rval.fRows) || (this->fCols != rval.fCols) )
		cout << "ERROR-> different TPZGenMatrix<TObj> size for addition";
	cout.flush();
	
	TObj *pbeg1 = this->fMem, *pfin;
	TObj *pbeg3 = rval.fMem;
	pfin = pbeg1 + (this->fRows*this->fCols);
	for ( ; pbeg1<pfin; pbeg1++, pbeg3++)
		*pbeg1 += *pbeg3;
	return (*this);
}